

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

tuple<unsigned_int,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* getSearchOptions_abi_cxx11_(int argc,char **argv,int startarg,bool istty)

{
  char *pcVar1;
  int in_ECX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  string *unaff_retaddr;
  string *in_stack_00000008;
  uint *in_stack_00000010;
  int i;
  char *in_stack_00000020;
  char *gopts;
  string exclude;
  string include;
  uint limit;
  uint options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_2;
  int iVar2;
  undefined4 in_stack_ffffffffffffff84;
  uint *in_stack_ffffffffffffff88;
  string local_68 [32];
  string local_48 [32];
  int local_28;
  uint local_24;
  byte local_1d;
  int local_1c;
  int local_c;
  
  local_1d = in_R8B & 1;
  local_24 = 0;
  if (local_1d != 0) {
    local_24 = 0x400;
  }
  local_28 = -1;
  __args_2 = in_RDI;
  local_1c = in_ECX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  pcVar1 = getenv("QGREP_OPTIONS");
  iVar2 = local_1c;
  if (pcVar1 != (char *)0x0) {
    parseSearchOptions(in_stack_00000020,_i,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    iVar2 = local_1c;
  }
  for (; iVar2 + 1 < local_c; iVar2 = iVar2 + 1) {
    parseSearchOptions(in_stack_00000020,_i,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  if ((local_24 & 0x78) == 0) {
    local_24 = local_24 | 0x10;
  }
  if ((local_24 & 0x400) != 0) {
    local_24 = local_24 | 0x800;
  }
  if (local_28 == 0) {
    local_28 = -1;
  }
  std::make_tuple<unsigned_int&,unsigned_int&,std::__cxx11::string&,std::__cxx11::string&>
            (in_stack_ffffffffffffff88,(uint *)CONCAT44(in_stack_ffffffffffffff84,iVar2),__args_2,
             in_RDI);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return (tuple<unsigned_int,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)__args_2;
}

Assistant:

std::tuple<unsigned int, unsigned int, std::string, std::string> getSearchOptions(int argc, const char** argv, int startarg, bool istty)
{
	unsigned int options = istty ? SO_HIGHLIGHT : 0;
	unsigned int limit = ~0u;
	std::string include, exclude;

	const char* gopts = getenv("QGREP_OPTIONS");

	// parse global options
	if (gopts)
		parseSearchOptions(gopts, options, limit, include, exclude);

	// parse command-line options
	for (int i = startarg; i + 1 < argc; ++i)
		parseSearchOptions(argv[i], options, limit, include, exclude);

	// choose default file search type
	if ((options & (SO_FILE_NAMEREGEX | SO_FILE_PATHREGEX | SO_FILE_VISUALASSIST | SO_FILE_FUZZY)) == 0)
		options |= SO_FILE_PATHREGEX;

	// highlighting includes match highlighting
	if (options & SO_HIGHLIGHT)
		options |= SO_HIGHLIGHT_MATCHES;

	// L0 means "no limit"
	if (limit == 0)
		limit = ~0u;

	return std::make_tuple(options, limit, include, exclude);
}